

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engrave.c
# Opt level: O3

int sengr_at(char *s,xchar x,xchar y)

{
  char *pcVar1;
  engr *peVar2;
  
  peVar2 = level->lev_engr;
  while( true ) {
    if (peVar2 == (engr *)0x0) {
      return 0;
    }
    if ((peVar2->engr_x == x) && (peVar2->engr_y == y)) break;
    peVar2 = peVar2->nxt_engr;
  }
  if (peVar2->engr_type == '\x06') {
    return 0;
  }
  if ((long)(ulong)moves < peVar2->engr_time) {
    return 0;
  }
  pcVar1 = strstri(peVar2->engr_txt,s);
  return (uint)(pcVar1 != (char *)0x0);
}

Assistant:

int sengr_at(const char *s, xchar x, xchar y)
{
	struct engr *ep = engr_at(level, x,y);

	return (ep && ep->engr_type != HEADSTONE &&
		ep->engr_time <= moves && strstri(ep->engr_txt, s) != 0);
}